

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

int iscleared(global_State *g,GCObject *o)

{
  char cVar1;
  uint uVar2;
  
  uVar2 = 0;
  if (((o != (GCObject *)0x0) && (uVar2 = o->marked & 0x18, (o->tt & 0xf) == 4)) &&
     (cVar1 = (char)uVar2, uVar2 = 0, cVar1 != '\0')) {
    reallymarkobject(g,o);
  }
  return uVar2;
}

Assistant:

static int iscleared (global_State *g, const GCObject *o) {
  if (o == NULL) return 0;  /* non-collectable value */
  else if (novariant(o->tt) == LUA_TSTRING) {
    markobject(g, o);  /* strings are 'values', so are never weak */
    return 0;
  }
  else return iswhite(o);
}